

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.cpp
# Opt level: O2

void __thiscall
FactoredDecPOMDPDiscrete::SetScopeForLRF
          (FactoredDecPOMDPDiscrete *this,Index LRF,Scope *X,Scope *A,Scope *Y,Scope *O)

{
  Scope Abackedup;
  Scope Xbackedup;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                         super_MultiAgentDecisionProcess + 0x1b0))(&local_48,this,Y,O);
  (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                         super_MultiAgentDecisionProcess + 0x1b8))(&local_60,this,Y,O);
  Scope::Insert((Scope *)&local_48,X);
  Scope::Sort((Scope *)&local_48);
  Scope::Insert((Scope *)&local_60,A);
  Scope::Sort((Scope *)&local_60);
  SetScopeForLRF(this,LRF,(Scope *)&local_48,(Scope *)&local_60);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_60);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void FactoredDecPOMDPDiscrete::SetScopeForLRF(Index LRF, 
            const Scope& X, //the X scope
            const Scope& A, //the A scope
            const Scope& Y,
            const Scope& O
        )
{
    Scope Xbackedup = StateScopeBackup( Y, O);
    Scope Abackedup = AgentScopeBackup( Y, O);
    // X'' = X' + X
    Xbackedup.Insert(X);
    Xbackedup.Sort();
    // A'' = A' + A
    Abackedup.Insert(A);
    Abackedup.Sort();
    SetScopeForLRF(LRF, Xbackedup, Abackedup);
}